

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O0

ConfidentialTransactionController *
cfd::api::TransactionApiBase::AddSign<cfd::ConfidentialTransactionController>
          (function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *create_controller,string *hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  bool bVar1;
  ulong uVar2;
  string *message;
  reference this;
  ConfidentialTxInReference *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ConfidentialTransactionController *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  byte in_stack_00000008;
  byte in_stack_00000010;
  SignParameter *sign_param_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range4_1;
  ScriptElement *element;
  iterator __end4;
  iterator __begin4;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range4;
  ScriptBuilder builder;
  Script script;
  ScriptOperator op_code;
  SignParameter *sign_param;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range2;
  bool has_op_code;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> sign_stack;
  ConfidentialTransactionController *txc;
  AbstractTxInReference *in_stack_fffffffffffffbd8;
  ConfidentialTxInReference *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbec;
  undefined1 in_stack_fffffffffffffbed;
  undefined1 in_stack_fffffffffffffbee;
  undefined1 in_stack_fffffffffffffbef;
  ConfidentialTransactionController *in_stack_fffffffffffffbf0;
  ConfidentialTransactionController *in_stack_fffffffffffffbf8;
  allocator *paVar3;
  Script local_3d8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_fffffffffffffc68;
  uint32_t in_stack_fffffffffffffc74;
  Txid *in_stack_fffffffffffffc78;
  ConfidentialTransactionController *in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc98;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_348;
  undefined8 local_340;
  reference local_338;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_330;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_328;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_320;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_308;
  ScriptBuilder local_300 [10];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe64;
  Txid *in_stack_fffffffffffffe68;
  ConfidentialTransactionController *in_stack_fffffffffffffe70;
  Script local_180;
  Script local_148;
  value_type local_110;
  ScriptOperator local_f8;
  reference local_c8;
  SignParameter *local_c0;
  __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_b8;
  undefined8 local_b0;
  byte local_a1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_a0;
  byte local_86;
  undefined1 local_85;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  byte local_32;
  byte local_31;
  undefined8 local_30;
  undefined4 local_24;
  ConfidentialTxInReference *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_31 = in_stack_00000008 & 1;
  local_32 = in_stack_00000010 & 1;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfdapi_transaction_base.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0xe2;
    local_50.funcname = "AddSign";
    core::logger::warn<std::__cxx11::string_const&>
              (&local_50,"Failed to AddSign. Invalid hex string. empty data. tx=[{}]",local_18);
    local_85 = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    paVar3 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Invalid hex string. empty data.",paVar3);
    core::CfdException::CfdException
              ((CfdException *)in_RCX,(CfdError)((ulong)paVar3 >> 0x20),message);
    local_85 = 0;
    __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_86 = 0;
  std::
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()((function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffffbf8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&local_a0);
  local_a1 = 0;
  local_b0 = local_30;
  local_b8._M_current =
       (SignParameter *)
       std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                 ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                  in_stack_fffffffffffffbd8);
  local_c0 = (SignParameter *)
             std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                       ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                        in_stack_fffffffffffffbd8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                             *)in_stack_fffffffffffffbe0,
                            (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                             *)in_stack_fffffffffffffbd8), bVar1) {
    local_c8 = __gnu_cxx::
               __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
               ::operator*(&local_b8);
    in_stack_fffffffffffffbef = SignParameter::IsOpCode(local_c8);
    if ((bool)in_stack_fffffffffffffbef) {
      SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffbee = core::ScriptOperator::IsPushOperator(&local_f8);
      if ((bool)in_stack_fffffffffffffbee) {
        local_a1 = 1;
      }
      core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x546ea0);
    }
    SignParameter::ConvertToSignature((SignParameter *)in_stack_fffffffffffffc98);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              (&local_a0,&local_110);
    core::ByteData::~ByteData((ByteData *)0x546edb);
    __gnu_cxx::
    __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
    ::operator++(&local_b8);
  }
  if ((local_31 & 1) == 0) {
    if ((local_a1 & 1) == 0) {
      if ((local_32 & 1) == 0) {
        ConfidentialTransactionController::InsertUnlockingScript
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                   in_stack_fffffffffffffe58);
      }
      else {
        ConfidentialTransactionController::SetUnlockingScript
                  ((ConfidentialTransactionController *)in_RCX,(Txid *)in_stack_fffffffffffffbf8,
                   (uint32_t)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   CONCAT17(in_stack_fffffffffffffbef,
                            CONCAT16(in_stack_fffffffffffffbee,
                                     CONCAT15(in_stack_fffffffffffffbed,
                                              CONCAT14(in_stack_fffffffffffffbec,
                                                       in_stack_fffffffffffffbe8)))));
      }
    }
    else {
      core::Script::Script(&local_148);
      if ((local_32 & 1) == 0) {
        ConfidentialTransactionController::GetTxIn
                  (in_stack_fffffffffffffbf8,(Txid *)in_stack_fffffffffffffbf0,
                   CONCAT13(in_stack_fffffffffffffbef,
                            CONCAT12(in_stack_fffffffffffffbee,
                                     CONCAT11(in_stack_fffffffffffffbed,in_stack_fffffffffffffbec)))
                  );
        core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffbd8);
        core::Script::operator=(&local_148,&local_180);
        core::Script::~Script((Script *)in_stack_fffffffffffffbe0);
        core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffbe0);
      }
      core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x5470c8);
      core::Script::GetElementList(&local_320,&local_148);
      local_308 = &local_320;
      local_328._M_current =
           (ScriptElement *)
           std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                     (local_308);
      local_330._M_current =
           (ScriptElement *)
           std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::end
                     (local_308);
      while (bVar1 = __gnu_cxx::operator!=(&local_328,&local_330), bVar1) {
        local_338 = __gnu_cxx::
                    __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                    ::operator*(&local_328);
        core::ScriptBuilder::AppendElement(local_300,local_338);
        __gnu_cxx::
        __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
        ::operator++(&local_328);
      }
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 in_stack_fffffffffffffbf0);
      local_340 = local_30;
      local_348._M_current =
           (SignParameter *)
           std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                     ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                      in_stack_fffffffffffffbd8);
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffffbd8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                                 *)in_stack_fffffffffffffbe0,
                                (__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                                 *)in_stack_fffffffffffffbd8), bVar1) {
        this = __gnu_cxx::
               __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
               ::operator*(&local_348);
        in_stack_fffffffffffffbed = SignParameter::IsOpCode(this);
        if ((bool)in_stack_fffffffffffffbed) {
          SignParameter::GetOpCode((SignParameter *)in_stack_fffffffffffffbd8);
          core::ScriptBuilder::AppendOperator(local_300,(ScriptOperator *)&stack0xfffffffffffffc78);
          core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x547284);
        }
        else {
          SignParameter::ConvertToSignature((SignParameter *)in_stack_fffffffffffffc98);
          core::ScriptBuilder::AppendData(local_300,(ByteData *)&stack0xfffffffffffffc60);
          core::ByteData::~ByteData((ByteData *)0x5472ea);
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
        ::operator++(&local_348);
      }
      core::ScriptBuilder::Build(&local_3d8,local_300);
      ConfidentialTransactionController::SetUnlockingScript
                ((ConfidentialTransactionController *)in_RCX,(Txid *)in_stack_fffffffffffffbf8,
                 (uint32_t)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                 (Script *)
                 CONCAT17(in_stack_fffffffffffffbef,
                          CONCAT16(in_stack_fffffffffffffbee,
                                   CONCAT15(in_stack_fffffffffffffbed,
                                            CONCAT14(in_stack_fffffffffffffbec,local_24)))));
      core::Script::~Script((Script *)local_20);
      core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x547383);
      core::Script::~Script((Script *)local_20);
      in_stack_fffffffffffffbe0 = local_20;
    }
  }
  else {
    if ((local_32 & 1) != 0) {
      ConfidentialTransactionController::RemoveWitnessStackAll
                (in_stack_fffffffffffffbf0,
                 (Txid *)CONCAT17(in_stack_fffffffffffffbef,
                                  CONCAT16(in_stack_fffffffffffffbee,
                                           CONCAT15(in_stack_fffffffffffffbed,
                                                    CONCAT14(in_stack_fffffffffffffbec,
                                                             in_stack_fffffffffffffbe8)))),
                 (uint32_t)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
    }
    ConfidentialTransactionController::AddWitnessStack
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
               in_stack_fffffffffffffc68);
  }
  local_86 = 1;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_fffffffffffffbf0);
  if ((local_86 & 1) == 0) {
    ConfidentialTransactionController::~ConfidentialTransactionController
              ((ConfidentialTransactionController *)in_stack_fffffffffffffbe0);
  }
  return in_RDI;
}

Assistant:

T TransactionApiBase::AddSign(
    std::function<T(const std::string&)> create_controller,
    const std::string& hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) {
  if (hex.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddSign. Invalid hex string. empty data. tx=[{}]", hex);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid hex string. empty data.");
  }

  // TransactionController作成
  T txc = create_controller(hex);

  std::vector<ByteData> sign_stack;
  bool has_op_code = false;
  for (const SignParameter& sign_param : sign_params) {
    if (sign_param.IsOpCode()) {
      ScriptOperator op_code = sign_param.GetOpCode();
      if (op_code.IsPushOperator()) {
        has_op_code = true;
      }
    }
    sign_stack.push_back(sign_param.ConvertToSignature());
  }

  if (is_witness) {
    // Witnessの追加
    if (clear_stack) {
      txc.RemoveWitnessStackAll(txid, vout);
    }
    txc.AddWitnessStack(txid, vout, sign_stack);
  } else if (!has_op_code) {
    if (clear_stack) {
      txc.SetUnlockingScript(txid, vout, sign_stack);
    } else {
      txc.InsertUnlockingScript(txid, vout, sign_stack);
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = txc.GetTxIn(txid, vout).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    txc.SetUnlockingScript(txid, vout, builder.Build());
  }

  return txc;
}